

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O0

bool __thiscall
lan::db::append<std::__cxx11::string>
          (db *this,db_bit *context,string *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,db_bit_type type)

{
  bool bVar1;
  db_bit_type type_00;
  string *context_00;
  db_bit *pdVar2;
  bool local_fa;
  string local_b8;
  byte local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  byte local_69;
  string local_68;
  db_bit_type local_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_30;
  db_bit_type type_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  string *name_local;
  db_bit *context_local;
  db *this_local;
  
  this->data = context;
  if ((this->data->type == Container) &&
     (pdVar2 = this->data->lin, this->data = pdVar2, pdVar2 != (db_bit *)0x0)) {
    local_34 = type;
    pbStack_30 = value;
    value_local = name;
    name_local = &context->key;
    context_local = (db_bit *)this;
    pdVar2 = get_last_bit(this,this->data);
    this->data = pdVar2;
    pdVar2 = (db_bit *)operator_new(0x50);
    db_bit::db_bit(pdVar2);
    context_00 = name_local;
    this->data->nex = pdVar2;
    this->data->nex->pre = this->data;
    this->data = this->data->nex;
    local_69 = 0;
    local_91 = 0;
    bVar1 = 8 < (int)local_34;
    if (bVar1) {
      pdVar2 = this->data;
      std::__cxx11::string::string((string *)&local_b8,(string *)name);
      local_fa = set_bit(this,(db_bit *)context_00,pdVar2,&local_b8,local_34);
    }
    else {
      pdVar2 = this->data;
      std::__cxx11::string::string((string *)&local_68,(string *)name);
      type_00 = local_34;
      local_69 = 1;
      std::__cxx11::string::string((string *)&local_90,(string *)value);
      local_91 = 1;
      local_fa = set_bit<std::__cxx11::string>
                           (this,(db_bit *)context_00,pdVar2,&local_68,type_00,&local_90);
    }
    this_local._7_1_ = local_fa;
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_b8);
    }
    if ((local_91 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_90);
    }
    if ((local_69 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool append(lan::db_bit * context, std::string const name, any const value, db_bit_type const type){
            data = context;
            if(data-> type == lan::Container and (data = data->lin)){
                data = get_last_bit(data);
                data->nex = new db_bit; data->nex->pre = data; data = data->nex;
                return ((type < lan::Array) ? set_bit(context, data, name, type, value) : set_bit(context, data, name, type));
            } return false;
        }